

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

void __thiscall PrintType::print(PrintType *this,Printer *p)

{
  Type *pTVar1;
  TupleType *pTVar2;
  int iVar3;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *pvVar4;
  Type *pTVar5;
  const_reference ppTVar6;
  PrintType local_b0;
  Format<PrintType> local_a8;
  Type *local_90;
  Type *type_type;
  Format<PrintType> local_80;
  Type *local_68;
  Type *value_type;
  Format<PrintType> local_58;
  Type *local_40;
  Type *element_type_1;
  value_type local_30;
  Type *element_type;
  size_t i;
  TupleType *tuple_type;
  Printer *p_local;
  PrintType *this_local;
  
  tuple_type = (TupleType *)p;
  p_local = (Printer *)this;
  iVar3 = (*this->type->_vptr_Type[2])();
  switch(iVar3) {
  case 0:
    Printer::print((Printer *)tuple_type,"Int");
    break;
  default:
    break;
  case 2:
    Printer::print((Printer *)tuple_type,"Function");
    break;
  case 3:
    Printer::print((Printer *)tuple_type,"Struct");
    break;
  case 4:
    Printer::print((Printer *)tuple_type,"Enum");
    break;
  case 5:
    i = (size_t)this->type;
    Printer::print((Printer *)tuple_type,"Tuple((");
    element_type = (Type *)0x0;
    while( true ) {
      pTVar1 = element_type;
      pvVar4 = TupleType::get_element_types((TupleType *)i);
      pTVar5 = (Type *)std::vector<const_Type_*,_std::allocator<const_Type_*>_>::size(pvVar4);
      if (pTVar5 <= pTVar1) break;
      pvVar4 = TupleType::get_element_types((TupleType *)i);
      ppTVar6 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                          (pvVar4,(size_type)element_type);
      local_30 = *ppTVar6;
      if (element_type != (Type *)0x0) {
        Printer::print((Printer *)tuple_type,",");
      }
      pTVar2 = tuple_type;
      PrintType((PrintType *)&element_type_1,local_30);
      Printer::print<PrintType>((Printer *)pTVar2,(PrintType *)&element_type_1);
      element_type = (Type *)((long)&element_type->_vptr_Type + 1);
    }
    Printer::print((Printer *)tuple_type,"))");
    break;
  case 6:
    local_40 = ArrayType::get_element_type((ArrayType *)this->type);
    pTVar2 = tuple_type;
    PrintType((PrintType *)&value_type,local_40);
    format<PrintType>(&local_58,"Array(%)",(PrintType *)&value_type);
    Printer::print<Format<PrintType>>((Printer *)pTVar2,&local_58);
    break;
  case 7:
    Printer::print((Printer *)tuple_type,"String");
    break;
  case 8:
    Printer::print((Printer *)tuple_type,"StringIterator");
    break;
  case 9:
    Printer::print((Printer *)tuple_type,"Void");
    break;
  case 10:
    local_68 = ReferenceType::get_type((ReferenceType *)this->type);
    pTVar2 = tuple_type;
    PrintType((PrintType *)&type_type,local_68);
    format<PrintType>(&local_80,"Reference(%)",(PrintType *)&type_type);
    Printer::print<Format<PrintType>>((Printer *)pTVar2,&local_80);
  case 0xb:
    local_90 = TypeType::get_type((TypeType *)this->type);
    pTVar2 = tuple_type;
    PrintType(&local_b0,local_90);
    format<PrintType>(&local_a8,"Type(%)",&local_b0);
    Printer::print<Format<PrintType>>((Printer *)pTVar2,&local_a8);
  }
  return;
}

Assistant:

void print(const Printer& p) const {
		switch (type->get_id()) {
		case TypeId::INT:
			p.print("Int");
			break;
		case TypeId::CLOSURE:
			p.print("Function");
			break;
		case TypeId::STRUCT:
			p.print("Struct");
			break;
		case TypeId::ENUM:
			p.print("Enum");
			break;
		case TypeId::TUPLE:
			{
				const TupleType* tuple_type = static_cast<const TupleType*>(type);
				p.print("Tuple((");
				for (std::size_t i = 0; i < tuple_type->get_element_types().size(); ++i) {
					const Type* element_type = tuple_type->get_element_types()[i];
					if (i > 0) p.print(",");
					p.print(PrintType(element_type));
				}
				p.print("))");
				break;
			}
		case TypeId::ARRAY:
			{
				const Type* element_type = static_cast<const ArrayType*>(type)->get_element_type();
				p.print(format("Array(%)", PrintType(element_type)));
				break;
			}
		case TypeId::STRING:
			p.print("String");
			break;
		case TypeId::STRING_ITERATOR:
			p.print("StringIterator");
			break;
		case TypeId::VOID:
			p.print("Void");
			break;
		case TypeId::REFERENCE:
			{
				const Type* value_type = static_cast<const ReferenceType*>(type)->get_type();
				p.print(format("Reference(%)", PrintType(value_type)));
			}
		case TypeId::TYPE:
			{
				const Type* type_type = static_cast<const TypeType*>(type)->get_type();
				p.print(format("Type(%)", PrintType(type_type)));
				break;
			}
		default:
			break;
		}
	}